

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O2

void __thiscall StringBuffer::appendBuffer(StringBuffer *this,char *buffer,long length)

{
  char cVar1;
  unsigned_long uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((length < 1) && (length = strlen(buffer), length < 1)) {
    return;
  }
  uVar4 = this->saLength;
  if (uVar4 < this->sLength + length) {
    uVar5 = uVar4 >> 3;
    if ((long)(uVar4 >> 3) < sbDefaultBoost) {
      uVar5 = sbDefaultBoost;
    }
    if (uVar5 <= (ulong)length) {
      uVar5 = length;
    }
    this->saLength = uVar5 + uVar4;
    pcVar3 = (char *)realloc(this->sData,uVar5 + uVar4 + 1);
    this->sData = pcVar3;
  }
  for (uVar4 = 0; length != uVar4; uVar4 = uVar4 + 1) {
    cVar1 = buffer[uVar4];
    uVar2 = this->sLength;
    this->sLength = uVar2 + 1;
    this->sData[uVar2] = cVar1;
  }
  this->sData[this->sLength] = '\0';
  return;
}

Assistant:

void StringBuffer::appendBuffer(const char *buffer, const long length) {
  long addThis, pl = length > 0 ? length : strlen(buffer);

  if (pl > 0) {
    if (saLength < sLength + pl) {
      addThis = saLength / 8;

      if (StringBuffer::sbDefaultBoost > addThis)
        addThis = StringBuffer::sbDefaultBoost;
      if (addThis < pl)
        addThis = pl;

      saLength += addThis;
      sData = (char *)realloc(sData, sizeof(char) * (saLength + 1));
    }
    for (addThis = 0; addThis < pl; addThis++)
      sData[sLength++] = buffer[addThis];

    sData[sLength] = 0;
  }
}